

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_DC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  huff_entropy_ptr_conflict entropy_00;
  JBLOCKROW block;
  int local_28;
  int Al;
  int blkn;
  int temp;
  huff_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_compress_ptr cinfo_local;
  
  entropy_00 = (huff_entropy_ptr_conflict)cinfo->entropy;
  iVar1 = cinfo->Al;
  entropy_00->next_output_byte = cinfo->dest->next_output_byte;
  entropy_00->free_in_buffer = cinfo->dest->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy_00->restarts_to_go == 0)) {
    emit_restart_e(entropy_00,entropy_00->next_restart_num);
  }
  for (local_28 = 0; local_28 < cinfo->blocks_in_MCU; local_28 = local_28 + 1) {
    emit_bits_e(entropy_00,(int)(*MCU_data[local_28])[0] >> ((byte)iVar1 & 0x1f),1);
  }
  cinfo->dest->next_output_byte = entropy_00->next_output_byte;
  cinfo->dest->free_in_buffer = entropy_00->free_in_buffer;
  if (cinfo->restart_interval != 0) {
    if (entropy_00->restarts_to_go == 0) {
      entropy_00->restarts_to_go = cinfo->restart_interval;
      entropy_00->next_restart_num = entropy_00->next_restart_num + 1;
      entropy_00->next_restart_num = entropy_00->next_restart_num & 7;
    }
    entropy_00->restarts_to_go = entropy_00->restarts_to_go - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  unsigned char *st;
  int Al, blkn;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;	/* use fixed probability estimation */
  Al = cinfo->Al;

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* We simply emit the Al'th bit of the DC coefficient value. */
    arith_encode(cinfo, st, (MCU_data[blkn][0][0] >> Al) & 1);
  }

  return TRUE;
}